

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  model_def_entry_t *pmVar2;
  float32 ***tmat;
  int32 iVar3;
  int iVar4;
  acmod_id_t aVar5;
  cmd_ln_t *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  uint32 *puVar10;
  model_def_entry_t *src;
  ulong uVar11;
  uint32 n_mgau;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint32 n_gau;
  uint32 n_feat;
  uint32 local_e4;
  model_def_t *dest_mdef;
  uint32 n_ts;
  model_def_t *src_mdef;
  uint32 n_state_pm;
  uint32 *veclen;
  uint32 n_cb_src;
  uint32 tmp_n_gau;
  uint32 tmp_n_feat;
  vector_t ***local_a8;
  vector_t ****local_a0;
  float32 ***local_98;
  vector_t ***src_var;
  vector_t ***local_88;
  float32 ***local_80;
  float32 ***src_tmat;
  vector_t ****src_fullvar;
  uint32 *tmp_veclen;
  vector_t ***src_mean;
  float32 ***src_mixw;
  uint32 n_mixw_src;
  ulong local_48;
  ulong local_40;
  uint32 n_tmat_src;
  
  parse_cmd_ln(argc,argv);
  src_var = (vector_t ***)0x0;
  src_fullvar = (vector_t ****)0x0;
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-src_moddeffn");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
          ,0x105,"Reading src %s\n",pcVar7);
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-src_moddeffn");
  iVar3 = model_def_read(&src_mdef,pcVar7);
  if (iVar3 == 0) {
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-src_ts2cbfn");
    iVar4 = strcmp(".semi.",pcVar7);
    if (iVar4 == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
              ,0x110,"Generating semi-continous ts2cb mapping\n");
      puVar10 = semi_ts2cb(src_mdef->n_tied_state);
      src_mdef->cb = puVar10;
      n_ts = src_mdef->n_tied_state;
      local_e4 = 1;
    }
    else {
      iVar4 = strcmp(".cont.",pcVar7);
      if (iVar4 == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                ,0x116,"Generating continous ts2cb mapping\n");
        puVar10 = cont_ts2cb(src_mdef->n_tied_state);
        src_mdef->cb = puVar10;
        local_e4 = src_mdef->n_tied_state;
        n_ts = local_e4;
      }
      else {
        iVar4 = strcmp(".ptm.",pcVar7);
        if (iVar4 == 0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                  ,0x11c,"Generating phonetically tied ts2cb mapping\n");
          puVar10 = ptm_ts2cb(src_mdef);
          src_mdef->cb = puVar10;
          n_ts = src_mdef->n_tied_state;
          local_e4 = src_mdef->acmod_set->n_ci;
        }
        else {
          pcVar6 = cmd_ln_get();
          pcVar8 = cmd_ln_str_r(pcVar6,"-src_ts2cbfn");
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                  ,0x122,"Reading src %s\n",pcVar8);
          iVar4 = s3ts2cb_read(pcVar7,&src_mdef->cb,&n_ts,&local_e4);
          if (iVar4 != 0) {
            return 1;
          }
        }
      }
    }
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-src_mixwfn");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
            ,299,"Reading src %s\n",pcVar7);
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-src_mixwfn");
    iVar4 = s3mixw_read(pcVar7,&src_mixw,&n_mixw_src,&n_feat,&n_gau);
    if (iVar4 == 0) {
      pcVar6 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar6,"-src_tmatfn");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
              ,0x135,"Reading src %s\n",pcVar7);
      pcVar6 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar6,"-src_tmatfn");
      iVar4 = s3tmat_read(pcVar7,&src_tmat,&n_tmat_src,&n_state_pm);
      if (iVar4 == 0) {
        pcVar6 = cmd_ln_get();
        pcVar7 = cmd_ln_str_r(pcVar6,"-src_meanfn");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                ,0x13e,"Reading src %s\n",pcVar7);
        pcVar6 = cmd_ln_get();
        pcVar7 = cmd_ln_str_r(pcVar6,"-src_meanfn");
        iVar4 = s3gau_read(pcVar7,&src_mean,&n_cb_src,&tmp_n_feat,&tmp_n_gau,&veclen);
        if (iVar4 == 0) {
          uVar12 = (ulong)tmp_n_feat;
          uVar11 = (ulong)n_feat;
          if (tmp_n_feat == n_feat) {
            uVar12 = (ulong)tmp_n_gau;
            uVar11 = (ulong)n_gau;
            if (tmp_n_gau == n_gau) {
              uVar12 = (ulong)n_cb_src;
              uVar11 = (ulong)local_e4;
              if (n_cb_src == local_e4) {
                pcVar6 = cmd_ln_get();
                pcVar7 = cmd_ln_str_r(pcVar6,"-src_varfn");
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                        ,0x156,"Reading src %s\n",pcVar7);
                pcVar6 = cmd_ln_get();
                lVar9 = cmd_ln_int_r(pcVar6,"-fullvar");
                pcVar6 = cmd_ln_get();
                pcVar7 = cmd_ln_str_r(pcVar6,"-src_varfn");
                if ((int)lVar9 == 0) {
                  iVar4 = s3gau_read(pcVar7,&src_var,&n_cb_src,&tmp_n_feat,&tmp_n_gau,&tmp_veclen);
                }
                else {
                  iVar4 = s3gau_read_full(pcVar7,&src_fullvar,&n_cb_src,&tmp_n_feat,&tmp_n_gau,
                                          &tmp_veclen);
                }
                if (iVar4 != 0) {
                  return 1;
                }
                uVar12 = (ulong)tmp_n_feat;
                uVar11 = (ulong)n_feat;
                if (tmp_n_feat == n_feat) {
                  uVar12 = (ulong)tmp_n_gau;
                  if (tmp_n_gau == n_gau) {
                    uVar12 = (ulong)n_cb_src;
                    if (n_cb_src == local_e4) {
                      uVar12 = (ulong)n_mixw_src;
                      if (src_mdef->n_tied_state <= n_mixw_src) {
                        if (uVar11 != 0) {
                          uVar12 = 0;
                          do {
                            if (veclen[uVar12] != tmp_veclen[uVar12]) {
                              err_msg(ERR_FATAL,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                      ,0x181,"src var veclen[%u] (== %u) != prior value (== %u)\n",
                                      uVar12,(ulong)tmp_veclen[uVar12],(ulong)veclen[uVar12]);
                              goto LAB_00103753;
                            }
                            uVar12 = uVar12 + 1;
                          } while (uVar11 != uVar12);
                        }
                        ckd_free(tmp_veclen);
                        pcVar6 = cmd_ln_get();
                        pcVar7 = cmd_ln_str_r(pcVar6,"-dest_moddeffn");
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                ,0x187,"Reading dest %s\n",pcVar7);
                        pcVar6 = cmd_ln_get();
                        pcVar7 = cmd_ln_str_r(pcVar6,"-dest_moddeffn");
                        iVar3 = model_def_read(&dest_mdef,pcVar7);
                        if (iVar3 < 0) {
                          return 1;
                        }
                        pcVar6 = cmd_ln_get();
                        pcVar7 = cmd_ln_str_r(pcVar6,"-dest_ts2cbfn");
                        iVar4 = strcmp(".semi.",pcVar7);
                        if (iVar4 == 0) {
                          err_msg(ERR_INFO,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                  ,0x191,"Generating semi-continous ts2cb mapping\n");
                          puVar10 = semi_ts2cb(dest_mdef->n_tied_state);
                          dest_mdef->cb = puVar10;
                          n_ts = dest_mdef->n_tied_state;
                          local_e4 = 1;
                        }
                        else {
                          iVar4 = strcmp(".cont.",pcVar7);
                          if (iVar4 == 0) {
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                    ,0x197,"Generating continous ts2cb mapping\n");
                            puVar10 = cont_ts2cb(dest_mdef->n_tied_state);
                            dest_mdef->cb = puVar10;
                            local_e4 = dest_mdef->n_tied_state;
                            n_ts = local_e4;
                          }
                          else {
                            iVar4 = strcmp(".ptm.",pcVar7);
                            if (iVar4 == 0) {
                              err_msg(ERR_INFO,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                      ,0x19d,"Generating phonetically tied ts2cb mapping\n");
                              puVar10 = ptm_ts2cb(dest_mdef);
                              dest_mdef->cb = puVar10;
                              n_ts = dest_mdef->n_tied_state;
                              local_e4 = dest_mdef->acmod_set->n_ci;
                            }
                            else {
                              pcVar6 = cmd_ln_get();
                              pcVar8 = cmd_ln_str_r(pcVar6,"-dest_ts2cbfn");
                              err_msg(ERR_INFO,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                      ,0x1a4,"Reading dest %s\n",pcVar8);
                              iVar4 = s3ts2cb_read(pcVar7,&dest_mdef->cb,&n_ts,&local_e4);
                              if (iVar4 != 0) {
                                return 1;
                              }
                            }
                          }
                        }
                        uVar14 = 0;
                        uVar15 = 1;
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                ,0x1af,"Calculating initial model parameters\n");
                        uVar1 = dest_mdef->n_tied_tmat;
                        tmat_dest_list = init_was_added(uVar1);
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                ,0x1b7,"Alloc %ux%ux%u dest tmat\n",(ulong)uVar1,
                                (ulong)(n_state_pm - 1),(ulong)n_state_pm);
                        local_40 = (ulong)uVar1;
                        local_80 = (float32 ***)
                                   __ckd_calloc_3d__((ulong)uVar1,(ulong)(n_state_pm - 1),
                                                     (ulong)n_state_pm,4,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                                  ,0x1bc);
                        uVar1 = dest_mdef->n_tied_state;
                        uVar12 = (ulong)uVar1;
                        mixw_dest_list = init_was_added(uVar1);
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                ,0x1c2,"Alloc %ux%ux%u dest mixw\n",(ulong)uVar1,(ulong)n_feat,
                                (ulong)n_gau);
                        local_98 = (float32 ***)
                                   __ckd_calloc_3d__(uVar12,(ulong)n_feat,(ulong)n_gau,4,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                                  ,0x1c3);
                        if (uVar12 != 0) {
                          uVar11 = 0;
                          do {
                            uVar1 = dest_mdef->cb[uVar11];
                            uVar15 = uVar14;
                            if (uVar14 < uVar1) {
                              uVar15 = uVar1;
                            }
                            if (uVar1 == 0xffffffff) {
                              uVar15 = uVar14;
                            }
                            uVar14 = uVar15;
                            uVar11 = uVar11 + 1;
                          } while (uVar12 != uVar11);
                          uVar15 = uVar14 + 1;
                        }
                        uVar11 = (ulong)uVar15;
                        cb_dest_list = init_was_added(uVar15);
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                ,0x1cf,"Alloc %ux%ux%u dest mean and var\n",(ulong)uVar15,
                                (ulong)n_feat,(ulong)n_gau);
                        local_88 = gauden_alloc_param(uVar15,n_feat,n_gau,veclen);
                        local_48 = uVar11;
                        if (src_var == (vector_t ***)0x0) {
                          if (src_fullvar == (vector_t ****)0x0) {
                            local_a0 = (vector_t ****)0x0;
                          }
                          else {
                            local_a0 = gauden_alloc_param_full(uVar15,n_feat,n_gau,veclen);
                          }
                          local_a8 = (vector_t ***)0x0;
                        }
                        else {
                          local_a8 = gauden_alloc_param(uVar15,n_feat,n_gau,veclen);
                          local_a0 = (vector_t ****)0x0;
                        }
                        if (dest_mdef->n_defn != 0) {
                          lVar9 = 0;
                          uVar11 = 0;
                          do {
                            pcVar7 = acmod_set_id2name(dest_mdef->acmod_set,(acmod_id_t)uVar11);
                            aVar5 = acmod_set_name2id(src_mdef->acmod_set,pcVar7);
                            if (aVar5 == 0xffffffff) {
                              aVar5 = acmod_set_base_phone(dest_mdef->acmod_set,(acmod_id_t)uVar11);
                              pcVar8 = acmod_set_id2name(dest_mdef->acmod_set,aVar5);
                              aVar5 = acmod_set_name2id(src_mdef->acmod_set,pcVar8);
                              if (aVar5 != 0xffffffff) {
                                pmVar2 = dest_mdef->defn;
                                src = src_mdef->defn + aVar5;
                                goto LAB_0010325c;
                              }
                              err_msg(ERR_INFO,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                      ,0x1e6,
                                      "No source base phone %s found.  Initializing %s using uniform distribution\n"
                                      ,pcVar8,pcVar7);
                              if (src_tmat != (float32 ***)0x0) {
                                err_msg(ERR_INFO,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                        ,0x1e9,"Uniform initialization of tmat not supported\n");
                              }
                              init_uniform(local_98,(model_def_entry_t *)
                                                    ((long)&dest_mdef->defn->p + lVar9),n_feat,n_gau
                                          );
                            }
                            else {
                              pmVar2 = dest_mdef->defn;
                              src = src_mdef->defn + aVar5;
LAB_0010325c:
                              init_model(local_98,local_88,local_a8,local_a0,local_80,
                                         (model_def_entry_t *)((long)&pmVar2->p + lVar9),
                                         dest_mdef->cb,dest_mdef->acmod_set,src_mixw,src_mean,
                                         src_var,src_fullvar,src_tmat,src,src_mdef->cb,
                                         src_mdef->acmod_set,n_feat,n_gau,n_state_pm,veclen);
                            }
                            uVar11 = uVar11 + 1;
                            lVar9 = lVar9 + 0x20;
                          } while (uVar11 < dest_mdef->n_defn);
                        }
                        uVar11 = local_48;
                        tmat = local_80;
                        if (uVar12 != 0) {
                          uVar13 = 0;
                          do {
                            if (mixw_dest_list[uVar13] == (pair_t *)0x0) {
                              err_msg(ERR_WARN,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                      ,0x203,"Destination state %u has not been initialized!\n",
                                      uVar13 & 0xffffffff);
                            }
                            uVar13 = uVar13 + 1;
                          } while (uVar12 != uVar13);
                        }
                        uVar12 = 0;
                        do {
                          if (cb_dest_list[uVar12] == (pair_t *)0x0) {
                            lVar9 = 0x209;
                            pcVar7 = "Destination cb %u has not been initialized!\n";
LAB_001033c1:
                            err_msg(ERR_WARN,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                    ,lVar9,pcVar7,uVar12 & 0xffffffff);
                          }
                          else if (cb_dest_list[uVar12]->next != (pair_str *)0x0) {
                            lVar9 = 0x20c;
                            pcVar7 = "dest cb %u has > 1 corresponding source cb\n";
                            goto LAB_001033c1;
                          }
                          uVar12 = uVar12 + 1;
                          if (uVar11 == uVar12) {
                            pcVar6 = cmd_ln_get();
                            pcVar7 = cmd_ln_str_r(pcVar6,"-dest_tmatfn");
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                    ,0x211,"Writing dest %s\n",pcVar7);
                            pcVar6 = cmd_ln_get();
                            pcVar7 = cmd_ln_str_r(pcVar6,"-dest_tmatfn");
                            iVar4 = s3tmat_write(pcVar7,tmat,(uint32)local_40,n_state_pm);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            pcVar6 = cmd_ln_get();
                            pcVar7 = cmd_ln_str_r(pcVar6,"-dest_mixwfn");
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                    ,0x21c,"Writing dest %s\n",pcVar7);
                            pcVar6 = cmd_ln_get();
                            pcVar7 = cmd_ln_str_r(pcVar6,"-dest_mixwfn");
                            iVar4 = s3mixw_write(pcVar7,local_98,dest_mdef->n_tied_state,n_feat,
                                                 n_gau);
                            if (iVar4 < 0) {
                              return 1;
                            }
                            pcVar6 = cmd_ln_get();
                            pcVar7 = cmd_ln_str_r(pcVar6,"-dest_meanfn");
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                    ,0x225,"Writing dest %s\n",pcVar7);
                            pcVar6 = cmd_ln_get();
                            pcVar7 = cmd_ln_str_r(pcVar6,"-dest_meanfn");
                            n_mgau = (uint32)uVar11;
                            iVar4 = s3gau_write(pcVar7,local_88,n_mgau,n_feat,n_gau,veclen);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            pcVar6 = cmd_ln_get();
                            pcVar7 = cmd_ln_str_r(pcVar6,"-dest_varfn");
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                                    ,0x231,"Writing dest %s\n",pcVar7);
                            pcVar6 = cmd_ln_get();
                            lVar9 = cmd_ln_int_r(pcVar6,"-fullvar");
                            pcVar6 = cmd_ln_get();
                            pcVar7 = cmd_ln_str_r(pcVar6,"-dest_varfn");
                            if ((int)lVar9 == 0) {
                              iVar4 = s3gau_write(pcVar7,local_a8,n_mgau,n_feat,n_gau,veclen);
                            }
                            else {
                              iVar4 = s3gau_write_full(pcVar7,local_a0,n_mgau,n_feat,n_gau,veclen);
                            }
                            if (iVar4 != 0) {
                              return 1;
                            }
                            ckd_free(veclen);
                            if (src_mean != (vector_t ***)0x0) {
                              gauden_free_param(src_mean);
                            }
                            if (src_var != (vector_t ***)0x0) {
                              gauden_free_param(src_var);
                            }
                            if (local_88 != (vector_t ***)0x0) {
                              gauden_free_param(local_88);
                            }
                            if (local_a8 != (vector_t ***)0x0) {
                              gauden_free_param(local_a8);
                            }
                            if (src_mdef != (model_def_t *)0x0) {
                              model_def_free(src_mdef);
                            }
                            if (dest_mdef != (model_def_t *)0x0) {
                              model_def_free(dest_mdef);
                            }
                            if (src_mixw != (float32 ***)0x0) {
                              ckd_free_3d(src_mixw);
                            }
                            if (local_98 != (float32 ***)0x0) {
                              ckd_free_3d(local_98);
                            }
                            if (src_tmat != (float32 ***)0x0) {
                              ckd_free_3d(src_tmat);
                            }
                            if (local_80 == (float32 ***)0x0) {
                              return 0;
                            }
                            ckd_free_3d(local_80);
                            return 0;
                          }
                        } while( true );
                      }
                      pcVar7 = "Too few source mixing weights, %u, for the # of tied states, %u\n";
                      lVar9 = 0x17b;
                      n_gau = src_mdef->n_tied_state;
                    }
                    else {
                      pcVar7 = "src var n_cb (== %u) inconsistent w/ ts2cb mapping %u\n";
                      lVar9 = 0x176;
                      n_gau = local_e4;
                    }
                  }
                  else {
                    pcVar7 = "src var n_gau (== %u) != prior value (== %u)\n";
                    lVar9 = 0x172;
                  }
                  uVar11 = (ulong)n_gau;
                }
                else {
                  pcVar7 = "src var n_feat (== %u) != prior value (== %u)\n";
                  lVar9 = 0x16e;
                }
              }
              else {
                pcVar7 = 
                "src mean n_cb (== %u) is inconsistent with ts2cb mapping %u. Most probably phoneset has duplicated phones\n"
                ;
                lVar9 = 0x153;
              }
            }
            else {
              pcVar7 = "src mean n_gau (== %u) != prior value (== %u)\n";
              lVar9 = 0x14f;
            }
          }
          else {
            pcVar7 = "src mean n_feat (== %u) != prior value (== %u)\n";
            lVar9 = 0x14b;
          }
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_mixw/main.c"
                  ,lVar9,pcVar7,uVar12,uVar11);
LAB_00103753:
          exit(1);
        }
      }
    }
  }
  return 1;
}

Assistant:

static int
initialize(int argc,
	   char *argv[])
{

    /* define, parse and (partially) validate the command line */
    parse_cmd_ln(argc, argv);

    return S3_SUCCESS;
}